

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O2

void create_file(string *filename,size_t file_size,
                vector<char,_std::allocator<char>_> *fill_with_vec)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  ofstream file;
  byte abStack_200 [480];
  
  std::ofstream::ofstream(&file,(string *)filename,_S_bin);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  if ((abStack_200[*(long *)(_file + -0x18)] & 5) == 0) {
    if ((file_size != 0) &&
       ((fill_with_vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (fill_with_vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      lVar2 = (long)(int)(file_size >> 0xc);
      iVar1 = (int)(lVar2 << 0xc);
      while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
        std::ostream::write((char *)&file,
                            (long)(fill_with_vec->super__Vector_base<char,_std::allocator<char>_>).
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      if ((int)file_size != iVar1 && -1 < (int)file_size - iVar1) {
        std::ostream::write((char *)&file,
                            (long)(fill_with_vec->super__Vector_base<char,_std::allocator<char>_>).
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      std::ostream::flush();
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"create file failed\n");
  }
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void create_file(std::string filename, size_t file_size,
                 const std::vector<char> &fill_with_vec) {
  std::ofstream file(filename, std::ios::binary);
  file.exceptions(std::ios_base::failbit | std::ios_base::badbit);

  if (!file) {
    std::cout << "create file failed\n";
    return;
  }
  size_t fill_with_size = fill_with_vec.size();
  if (file_size == 0 || fill_with_size == 0) {
    return;
  }
  int cnt = file_size / block_size;
  int remain = file_size - block_size * cnt;
  for (size_t i = 0; i < cnt; i++) {
    file.write(fill_with_vec.data(), block_size);
  }
  if (remain > 0) {
    file.write(fill_with_vec.data(), remain);
  }
  file.flush();  // can throw
  return;
}